

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool ON_NurbsSurface::ON_Internal_MakeKnotVectorsCompatible
               (ON_NurbsCurve *nurbs_curveA,ON_NurbsCurve *nurbs_curveB)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int desired_capacity;
  uint uVar7;
  double *pdVar8;
  double dVar9;
  int local_78;
  int local_74;
  int kiB;
  int kiA;
  bool bPeriodic;
  int max_knot_capacity;
  int knot_countB;
  int knot_countA;
  int multB;
  int multA;
  int ki;
  int i;
  double b;
  double a;
  double ktol;
  ON_Interval span;
  int order;
  ON_NurbsCurve *nurbs_curveB_local;
  ON_NurbsCurve *nurbs_curveA_local;
  
  bVar4 = ON_MakeDegreesCompatible(nurbs_curveA,nurbs_curveB);
  if (!bVar4) {
    return false;
  }
  bVar4 = ON_MakeDomainsCompatible(nurbs_curveA,nurbs_curveB);
  if (!bVar4) {
    return false;
  }
  span.m_t[1]._4_4_ = nurbs_curveA->m_order;
  ON_Interval::ON_Interval((ON_Interval *)&ktol);
  iVar5 = ON_NurbsCurve::KnotCount(nurbs_curveA);
  iVar6 = ON_NurbsCurve::KnotCount(nurbs_curveB);
  desired_capacity = iVar5 + iVar6 + (span.m_t[1]._4_4_ + -1) * -2;
  bVar4 = false;
  uVar7 = (*(nurbs_curveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])
                    ();
  if (((uVar7 & 1) != 0) ||
     (uVar7 = (*(nurbs_curveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x35])(), (uVar7 & 1) != 0)) {
    bVar4 = true;
    multB = 0;
    while( true ) {
      bVar3 = false;
      if (multB < span.m_t[1]._4_4_ + -2) {
        bVar3 = bVar4;
      }
      if (!bVar3) break;
      if ((nurbs_curveA->m_knot[multB] != nurbs_curveB->m_knot[multB]) ||
         (NAN(nurbs_curveA->m_knot[multB]) || NAN(nurbs_curveB->m_knot[multB]))) {
        bVar4 = false;
      }
      multB = multB + 1;
    }
    local_74 = nurbs_curveA->m_cv_count;
    local_78 = nurbs_curveB->m_cv_count;
    while( true ) {
      bVar3 = false;
      if ((local_74 < iVar5) && (bVar3 = false, local_78 < iVar6)) {
        bVar3 = bVar4;
      }
      if (!bVar3) break;
      if ((nurbs_curveA->m_knot[local_74] != nurbs_curveB->m_knot[local_74]) ||
         (NAN(nurbs_curveA->m_knot[local_74]) || NAN(nurbs_curveB->m_knot[local_74]))) {
        bVar4 = false;
      }
      local_74 = local_74 + 1;
      local_78 = local_78 + 1;
    }
  }
  if (!bVar4) {
    bVar4 = ON_NurbsCurve::ClampEnd(nurbs_curveA,2);
    if (!bVar4) {
      return false;
    }
    bVar4 = ON_NurbsCurve::ClampEnd(nurbs_curveB,2);
    if (!bVar4) {
      return false;
    }
  }
  multB = span.m_t[1]._4_4_ + -1;
  while( true ) {
    if ((multB < nurbs_curveA->m_cv_count + -1) ||
       (bVar4 = false, multB < nurbs_curveB->m_cv_count + -1)) {
      bVar4 = false;
      if ((nurbs_curveA->m_knot[multB + -1] == nurbs_curveB->m_knot[multB + -1]) &&
         ((!NAN(nurbs_curveA->m_knot[multB + -1]) && !NAN(nurbs_curveB->m_knot[multB + -1]) &&
          (bVar4 = false, multB <= nurbs_curveA->m_cv_count + -1)))) {
        bVar4 = multB <= nurbs_curveB->m_cv_count + -1;
      }
    }
    if (!bVar4) {
      if (nurbs_curveA->m_cv_count != nurbs_curveB->m_cv_count) {
        return false;
      }
      iVar5 = ON_NurbsCurve::KnotCount(nurbs_curveA);
      multB = 0;
      while( true ) {
        if (iVar5 <= multB) {
          return true;
        }
        if ((nurbs_curveA->m_knot[multB] != nurbs_curveB->m_knot[multB]) ||
           (NAN(nurbs_curveA->m_knot[multB]) || NAN(nurbs_curveB->m_knot[multB]))) break;
        multB = multB + 1;
      }
      return false;
    }
    b = nurbs_curveA->m_knot[multB];
    if ((b == nurbs_curveA->m_knot[multB + -1]) &&
       (!NAN(b) && !NAN(nurbs_curveA->m_knot[multB + -1]))) {
      return false;
    }
    _ki = nurbs_curveB->m_knot[multB];
    if ((_ki == nurbs_curveB->m_knot[multB + -1]) &&
       (!NAN(_ki) && !NAN(nurbs_curveB->m_knot[multB + -1]))) break;
    knot_countA = ON_KnotMultiplicity(span.m_t[1]._4_4_,nurbs_curveA->m_cv_count,
                                      nurbs_curveA->m_knot,multB);
    knot_countB = ON_KnotMultiplicity(span.m_t[1]._4_4_,nurbs_curveB->m_cv_count,
                                      nurbs_curveB->m_knot,multB);
    if (_ki <= b) {
      if (_ki < b) {
        ON_Interval::Set((ON_Interval *)&ktol,nurbs_curveA->m_knot[multB + -1],
                         nurbs_curveA->m_knot[multB]);
        dVar9 = ON_Interval::Length((ON_Interval *)&ktol);
        dVar1 = nurbs_curveA->m_knot[multB + -1];
        dVar2 = nurbs_curveA->m_knot[multB];
        pdVar8 = ON_Interval::operator[]((ON_Interval *)&ktol,1);
        if (_ki < *pdVar8 - (dVar9 + ABS(dVar1) + ABS(dVar2)) * 1.490116119385e-08) {
          ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveA,desired_capacity);
          ON_NurbsCurve::InsertKnot(nurbs_curveA,_ki,knot_countB);
        }
        else {
          for (multA = multB; multA < multB + knot_countA; multA = multA + 1) {
            nurbs_curveA->m_knot[multA] = _ki;
          }
        }
        b = nurbs_curveA->m_knot[multB];
        knot_countA = ON_KnotMultiplicity(span.m_t[1]._4_4_,nurbs_curveA->m_cv_count,
                                          nurbs_curveA->m_knot,multB);
      }
    }
    else {
      ON_Interval::Set((ON_Interval *)&ktol,nurbs_curveB->m_knot[multB + -1],
                       nurbs_curveB->m_knot[multB]);
      dVar9 = ON_Interval::Length((ON_Interval *)&ktol);
      dVar1 = nurbs_curveB->m_knot[multB + -1];
      dVar2 = nurbs_curveB->m_knot[multB];
      pdVar8 = ON_Interval::operator[]((ON_Interval *)&ktol,1);
      if (b < *pdVar8 - (dVar9 + ABS(dVar1) + ABS(dVar2)) * 1.490116119385e-08) {
        ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveB,desired_capacity);
        ON_NurbsCurve::InsertKnot(nurbs_curveB,b,knot_countA);
      }
      else {
        for (multA = multB; multA < multB + knot_countB; multA = multA + 1) {
          nurbs_curveB->m_knot[multA] = b;
        }
      }
      _ki = nurbs_curveB->m_knot[multB];
      knot_countB = ON_KnotMultiplicity(span.m_t[1]._4_4_,nurbs_curveB->m_cv_count,
                                        nurbs_curveB->m_knot,multB);
    }
    if ((b != _ki) || (NAN(b) || NAN(_ki))) {
      return false;
    }
    if ((b == _ki) && (!NAN(b) && !NAN(_ki))) {
      if (knot_countA < knot_countB) {
        ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveA,desired_capacity);
        bVar4 = ON_NurbsCurve::InsertKnot(nurbs_curveA,b,knot_countB);
        if (!bVar4) {
          return false;
        }
        knot_countA = knot_countB;
      }
      else if (knot_countB < knot_countA) {
        ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveB,desired_capacity);
        bVar4 = ON_NurbsCurve::InsertKnot(nurbs_curveB,b,knot_countA);
        if (!bVar4) {
          return false;
        }
      }
      multB = knot_countA + multB;
    }
  }
  return false;
}

Assistant:

bool ON_NurbsSurface::ON_Internal_MakeKnotVectorsCompatible(
       ON_NurbsCurve& nurbs_curveA,
       ON_NurbsCurve& nurbs_curveB
       )
{
  if ( !ON_MakeDegreesCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;
  if ( !ON_MakeDomainsCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;

  const int order = nurbs_curveA.m_order;
  ON_Interval span;
  double ktol, a, b;
  int i, ki, multA, multB;
  int knot_countA = nurbs_curveA.KnotCount();
  int knot_countB = nurbs_curveB.KnotCount();
  int max_knot_capacity = knot_countA + knot_countB - 2*(order-1);

  bool bPeriodic = false;
  if ( nurbs_curveA.IsPeriodic() || nurbs_curveB.IsPeriodic() )
  {
    bPeriodic = true;
    for ( ki = 0; ki < order-2 && bPeriodic; ki++ )
    {
      if ( nurbs_curveA.m_knot[ki] != nurbs_curveB.m_knot[ki] )
        bPeriodic = false;
    }
    int kiA, kiB;
    for (
      kiA = nurbs_curveA.m_cv_count,
      kiB = nurbs_curveB.m_cv_count;
      kiA < knot_countA && kiB < knot_countB && bPeriodic;
      kiA++, kiB++ )
    {
      if ( nurbs_curveA.m_knot[kiA] != nurbs_curveB.m_knot[kiA] )
        bPeriodic = false;
    }
  }
  if ( !bPeriodic )
  {
    if ( !nurbs_curveA.ClampEnd(2) )
      return false;
    if ( !nurbs_curveB.ClampEnd(2) )
      return false;
  }

  ki = order-1; 
  while ( (ki < nurbs_curveA.m_cv_count-1 || ki < nurbs_curveB.m_cv_count-1)
          && nurbs_curveA.m_knot[ki-1] == nurbs_curveB.m_knot[ki-1]
          && ki <= nurbs_curveA.m_cv_count-1
          && ki <= nurbs_curveB.m_cv_count-1
          )
  {
    a = nurbs_curveA.m_knot[ki];
    if ( a == nurbs_curveA.m_knot[ki-1] )
      return false;
    b = nurbs_curveB.m_knot[ki];
    if ( b == nurbs_curveB.m_knot[ki-1] )
      return false;
    multA = ON_KnotMultiplicity( order, nurbs_curveA.m_cv_count, nurbs_curveA.m_knot, ki );
    multB = ON_KnotMultiplicity( order, nurbs_curveB.m_cv_count, nurbs_curveB.m_knot, ki );

    if ( a < b )
    {
      // insert a in nurbs_curveB
      span.Set(nurbs_curveB.m_knot[ki-1], nurbs_curveB.m_knot[ki] );
      ktol = ON_SQRT_EPSILON*(span.Length() + fabs(nurbs_curveB.m_knot[ki-1]) + fabs(nurbs_curveB.m_knot[ki]) );
      if ( a >= span[1] - ktol )
      {
        for ( i = ki; i < ki+multB; i++ )
          nurbs_curveB.m_knot[i] = a;          
      }
      else
      {
        nurbs_curveB.ReserveKnotCapacity( max_knot_capacity );
        nurbs_curveB.InsertKnot( a, multA );
      }
      b = nurbs_curveB.m_knot[ki];
      multB = ON_KnotMultiplicity( order, nurbs_curveB.m_cv_count, nurbs_curveB.m_knot, ki );
    }
    else if ( b < a )
    {
      // insert b in nurbs_curveA
      span.Set(nurbs_curveA.m_knot[ki-1], nurbs_curveA.m_knot[ki] );
      ktol = ON_SQRT_EPSILON*(span.Length() + fabs(nurbs_curveA.m_knot[ki-1]) + fabs(nurbs_curveA.m_knot[ki]) );
      if ( b >= span[1] - ktol )
      {
        for ( i = ki; i < ki+multA; i++ )
          nurbs_curveA.m_knot[i] = b;
      }
      else
      {
        nurbs_curveA.ReserveKnotCapacity( max_knot_capacity );
        nurbs_curveA.InsertKnot( b, multB );
      }
      a = nurbs_curveA.m_knot[ki];
      multA = ON_KnotMultiplicity( order, nurbs_curveA.m_cv_count, nurbs_curveA.m_knot, ki );
    }

    if ( a != b )
      return false;

    if ( a == b )
    {
      if ( multA < multB )
      {
        nurbs_curveA.ReserveKnotCapacity( max_knot_capacity );
        if ( !nurbs_curveA.InsertKnot( a, multB ) )
          return false;
        multA = multB;
      }
      else if ( multB < multA )
      {
        nurbs_curveB.ReserveKnotCapacity( max_knot_capacity );
        if ( !nurbs_curveB.InsertKnot( a, multA ) )
          return false;
        multB = multA;
      }
      ki += multA;
    }
  }

  if ( nurbs_curveA.m_cv_count != nurbs_curveB.m_cv_count )
    return false;
  knot_countA = nurbs_curveA.KnotCount();
  for ( ki = 0; ki < knot_countA; ki++ )
  {
    if ( nurbs_curveA.m_knot[ki] != nurbs_curveB.m_knot[ki] )
      return false;
  }

  return true;
}